

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O0

int Ssw_ManSweepLatch(Ssw_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Man_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  Aig_Obj_t *pAVar6;
  Ssw_Sat_t *pSVar7;
  int local_38;
  int local_34;
  int k;
  int i;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vClass;
  Ssw_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p->pAig);
  pAVar2 = Aig_ManStart(iVar1);
  p->pFrames = pAVar2;
  pAVar3 = Aig_ManConst1(p->pAig);
  pAVar4 = Aig_ManConst1(p->pFrames);
  Ssw_ObjSetFrame(p,pAVar3,0,pAVar4);
  for (local_34 = 0; iVar1 = Saig_ManPiNum(p->pAig), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_34);
    pAVar4 = Aig_ObjCreateCi(p->pFrames);
    Ssw_ObjSetFrame(p,pAVar3,0,pAVar4);
  }
  for (local_34 = 0; iVar1 = Saig_ManRegNum(p->pAig), local_34 < iVar1; local_34 = local_34 + 1) {
    pVVar5 = p->pAig->vCis;
    iVar1 = Saig_ManPiNum(p->pAig);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,local_34 + iVar1);
    pAVar4 = Aig_ObjRepr(p->pAig,pAVar3);
    if (pAVar4 == (Aig_Obj_t *)0x0) {
      _k = Aig_ObjCreateCi(p->pFrames);
      (_k->field_5).pData = pAVar3;
    }
    else {
      pAVar6 = Ssw_ObjFrame(p,pAVar4,0);
      _k = Aig_NotCond(pAVar6,(uint)(*(ulong *)&pAVar4->field_0x18 >> 3) & 1 ^
                              (uint)(*(ulong *)&pAVar3->field_0x18 >> 3) & 1);
    }
    Ssw_ObjSetFrame(p,pAVar3,0,_k);
  }
  Aig_ManSetCioIds(p->pFrames);
  if (p->vSimInfo != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vSimInfo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswLcorr.c"
                  ,0x10c,"int Ssw_ManSweepLatch(Ssw_Man_t *)");
  }
  iVar1 = Aig_ManCiNum(p->pFrames);
  pVVar5 = Vec_PtrAllocSimInfo(iVar1,1);
  p->vSimInfo = pVVar5;
  Vec_PtrCleanSimInfo(p->vSimInfo,0,1);
  pVVar5 = Vec_PtrAlloc(100);
  p->fRefined = 0;
  p->nCallsUnsat = 0;
  p->nCallsSat = 0;
  p->nCallsCount = 0;
  local_34 = 0;
  do {
    iVar1 = Saig_ManRegNum(p->pAig);
    if (iVar1 <= local_34) {
      if (0 < p->nPatterns) {
        Ssw_ManSweepResimulate(p);
      }
      Vec_PtrFree(pVVar5);
      return p->fRefined;
    }
    p_00 = p->pAig->vCis;
    iVar1 = Saig_ManPiNum(p->pAig);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_34 + iVar1);
    iVar1 = Ssw_ObjIsConst1Cand(p->pAig,pAVar3);
    if (iVar1 == 0) {
      Ssw_ClassesCollectClass(p->ppClasses,pAVar3,pVVar5);
      iVar1 = Vec_PtrSize(pVVar5);
      if (iVar1 != 0) {
        for (local_38 = 0; iVar1 = Vec_PtrSize(pVVar5), local_38 < iVar1; local_38 = local_38 + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,local_38);
          pAVar6 = Aig_ObjRepr(p->pAig,pAVar4);
          if ((pAVar6 == pAVar3) && (Ssw_ManSweepLatchOne(p,pAVar3,pAVar4), p->nPatterns == 0x20))
          break;
        }
        goto LAB_007c2630;
      }
    }
    else {
      pAVar4 = Aig_ManConst1(p->pAig);
      Ssw_ManSweepLatchOne(p,pAVar4,pAVar3);
LAB_007c2630:
      if (p->nPatterns == 0x20) {
        Ssw_ManSweepResimulate(p);
      }
      if (((p->pPars->nSatVarMax != 0) && (p->pPars->nSatVarMax < p->pMSat->nSatVars)) &&
         (p->pPars->nRecycleCalls < p->nRecycleCalls)) {
        iVar1 = Abc_MaxInt(p->nVarsMax,p->pMSat->nSatVars);
        p->nVarsMax = iVar1;
        iVar1 = Abc_MaxInt(p->nCallsMax,p->pMSat->nSolverCalls);
        p->nCallsMax = iVar1;
        Ssw_SatStop(p->pMSat);
        pSVar7 = Ssw_SatStart(0);
        p->pMSat = pSVar7;
        p->nRecycles = p->nRecycles + 1;
        p->nRecycleCalls = 0;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

int Ssw_ManSweepLatch( Ssw_Man_t * p )
{
//    Bar_Progress_t * pProgress = NULL;
    Vec_Ptr_t * vClass;
    Aig_Obj_t * pObj, * pRepr, * pTemp;
    int i, k;

    // start the timeframe
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) );
    // map constants and PIs
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), 0, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(p->pFrames) );

    // implement equivalence classes
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        pRepr = Aig_ObjRepr( p->pAig, pObj );
        if ( pRepr == NULL )
        {
            pTemp = Aig_ObjCreateCi(p->pFrames);
            pTemp->pData = pObj;
        }
        else
            pTemp = Aig_NotCond( Ssw_ObjFrame(p, pRepr, 0), pRepr->fPhase ^ pObj->fPhase );
        Ssw_ObjSetFrame( p, pObj, 0, pTemp );
    }
    Aig_ManSetCioIds( p->pFrames );

    // prepare simulation info
    assert( p->vSimInfo == NULL );
    p->vSimInfo = Vec_PtrAllocSimInfo( Aig_ManCiNum(p->pFrames), 1 );
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );

    // go through the registers
//    if ( p->pPars->fVerbose )
//        pProgress = Bar_ProgressStart( stdout, Aig_ManRegNum(p->pAig) );
    vClass = Vec_PtrAlloc( 100 );
    p->fRefined = 0;
    p->nCallsCount = p->nCallsSat = p->nCallsUnsat = 0;
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
//        if ( p->pPars->fVerbose )
//            Bar_ProgressUpdate( pProgress, i, NULL );
        // consider the case of constant candidate
        if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
            Ssw_ManSweepLatchOne( p, Aig_ManConst1(p->pAig), pObj );
        else
        {
            // consider the case of equivalence class
            Ssw_ClassesCollectClass( p->ppClasses, pObj, vClass );
            if ( Vec_PtrSize(vClass) == 0 )
                continue;
            // try to prove equivalences in this class
            Vec_PtrForEachEntry( Aig_Obj_t *, vClass, pTemp, k )
                if ( Aig_ObjRepr(p->pAig, pTemp) == pObj )
                {
                    Ssw_ManSweepLatchOne( p, pObj, pTemp );
                    if ( p->nPatterns == 32 )
                        break;
                }
        }
        // resimulate
        if ( p->nPatterns == 32 )
            Ssw_ManSweepResimulate( p );
        // attempt recycling the SAT solver
        if ( p->pPars->nSatVarMax &&
             p->pMSat->nSatVars > p->pPars->nSatVarMax &&
             p->nRecycleCalls > p->pPars->nRecycleCalls )
        {
            p->nVarsMax  = Abc_MaxInt( p->nVarsMax,  p->pMSat->nSatVars );
            p->nCallsMax = Abc_MaxInt( p->nCallsMax, p->pMSat->nSolverCalls );
            Ssw_SatStop( p->pMSat );
            p->pMSat = Ssw_SatStart( 0 );
            p->nRecycles++;
            p->nRecycleCalls = 0;
        }
    }
//    ABC_PRT( "reduce", p->timeReduce );
//    Aig_TableProfile( p->pFrames );
//    Abc_Print( 1, "And gates = %d\n", Aig_ManNodeNum(p->pFrames) );
    // resimulate
    if ( p->nPatterns > 0 )
        Ssw_ManSweepResimulate( p );
    // cleanup
    Vec_PtrFree( vClass );
//    if ( p->pPars->fVerbose )
//        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    return p->fRefined;
}